

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<TPZEqnArray<double>_>::ReallocForNuma(TPZVec<TPZEqnArray<double>_> *this)

{
  TPZEqnArray<double> *__dest;
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  long lVar4;
  long lVar5;
  TPZEqnArray<double> *pTVar6;
  ulong uVar7;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (this->fStore != (TPZEqnArray<double> *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x3290),8) == 0) {
      uVar7 = SUB168(auVar2 * ZEXT816(0x3290),0) | 8;
    }
    puVar3 = (ulong *)operator_new__(uVar7);
    *puVar3 = uVar1;
    __dest = (TPZEqnArray<double> *)(puVar3 + 1);
    lVar4 = 0;
    pTVar6 = __dest;
    do {
      TPZEqnArray<double>::TPZEqnArray(pTVar6);
      lVar4 = lVar4 + -0x3290;
      pTVar6 = pTVar6 + 1;
    } while (uVar1 * -0x3290 - lVar4 != 0);
    pTVar6 = this->fStore;
    memcpy(__dest,pTVar6,this->fNElements * 0x3290);
    if (pTVar6 != (TPZEqnArray<double> *)0x0) {
      lVar4 = *(long *)&pTVar6[-1].fLastTerm;
      if (lVar4 != 0) {
        lVar5 = lVar4 * 0x3290;
        do {
          TPZEqnArray<double>::~TPZEqnArray
                    ((TPZEqnArray<double> *)
                     ((long)pTVar6[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28));
          lVar5 = lVar5 + -0x3290;
        } while (lVar5 != 0);
      }
      operator_delete__(&pTVar6[-1].fLastTerm,lVar4 * 0x3290 | 8);
    }
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}